

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

void __thiscall
icu_63::Format::parseObject
          (Format *this,UnicodeString *source,Formattable *result,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  undefined1 local_38 [8];
  ParsePosition parsePosition;
  UErrorCode *status_local;
  Formattable *result_local;
  UnicodeString *source_local;
  Format *this_local;
  
  parsePosition._8_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    ParsePosition::ParsePosition((ParsePosition *)local_38,0);
    (*(this->super_UObject)._vptr_UObject[7])(this,source,result,(ParsePosition *)local_38);
    iVar2 = ParsePosition::getIndex((ParsePosition *)local_38);
    if (iVar2 == 0) {
      *(undefined4 *)parsePosition._8_8_ = 3;
    }
    ParsePosition::~ParsePosition((ParsePosition *)local_38);
  }
  return;
}

Assistant:

void
Format::parseObject(const UnicodeString& source,
                    Formattable& result,
                    UErrorCode& status) const
{
    if (U_FAILURE(status)) return;

    ParsePosition parsePosition(0);
    parseObject(source, result, parsePosition);
    if (parsePosition.getIndex() == 0) {
        status = U_INVALID_FORMAT_ERROR;
    }
}